

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_commands.cpp
# Opt level: O0

Am_Value am_checked_from_command_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar3;
  Am_Object *in_RSI;
  Am_Value AVar4;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object cmd;
  undefined1 local_30 [8];
  Am_Value v;
  Am_Object *self_local;
  Am_Value *ret;
  
  v.value.long_value._7_1_ = 0;
  Am_Value::Am_Value((Am_Value *)self,&Am_No_Value);
  Am_Value::Am_Value((Am_Value *)local_30);
  pAVar2 = Am_Object::Peek(in_RSI,0xc5,0);
  Am_Value::operator=((Am_Value *)local_30,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)local_30);
  if ((bVar1) && (local_30._0_2_ == 0xa001)) {
    Am_Object::Am_Object(&local_48,(Am_Value *)local_30);
    Am_Object::Am_Object(&local_50,&Am_Command);
    bVar1 = Am_Object::Is_Instance_Of(&local_48,&local_50);
    Am_Object::~Am_Object(&local_50);
    if (bVar1) {
      pAVar2 = Am_Object::Peek(&local_48,0x1ab,0);
      Am_Value::operator=((Am_Value *)self,pAVar2);
    }
    Am_Object::~Am_Object(&local_48);
  }
  v.value.long_value._7_1_ = 1;
  Am_Value::~Am_Value((Am_Value *)local_30);
  aVar3 = extraout_RDX;
  if ((v.value.long_value._7_1_ & 1) == 0) {
    Am_Value::~Am_Value((Am_Value *)self);
    aVar3 = extraout_RDX_00;
  }
  AVar4.value.wrapper_value = aVar3.wrapper_value;
  AVar4._0_8_ = self;
  return AVar4;
}

Assistant:

Am_Define_Formula(Am_Value, am_checked_from_command)
{
  Am_Value ret = Am_No_Value; // not checked if no command object
  Am_Value v;
  v = self.Peek(Am_COMMAND);
  if (v.Valid() && v.type == Am_OBJECT) {
    Am_Object cmd = v;
    if (cmd.Is_Instance_Of(Am_Command))
      ret = cmd.Peek(Am_CHECKED_ITEM);
  }
  return ret;
}